

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.c
# Opt level: O0

double json_object_get_double(json_object *jso)

{
  int64_t iVar1;
  json_object_double *pjVar2;
  json_object_int *pjVar3;
  json_object_boolean *pjVar4;
  char *pcVar5;
  char *pcVar6;
  int *piVar7;
  undefined1 auVar8 [16];
  char *local_28;
  char *errPtr;
  double cdouble;
  json_object *jso_local;
  
  local_28 = (char *)0x0;
  if (jso == (json_object *)0x0) {
    jso_local = (json_object *)0x0;
  }
  else {
    cdouble = (double)jso;
    switch(jso->o_type) {
    case json_type_boolean:
      pjVar4 = JC_BOOL_C(jso);
      jso_local = (json_object *)(double)pjVar4->c_boolean;
      break;
    case json_type_double:
      pjVar2 = JC_DOUBLE_C(jso);
      jso_local = (json_object *)pjVar2->c_double;
      break;
    case json_type_int:
      pjVar3 = JC_INT_C(jso);
      if (pjVar3->cint_type == json_object_int_type_int64) {
        pjVar3 = JC_INT_C((json_object *)cdouble);
        jso_local = (json_object *)(double)(pjVar3->cint).c_int64;
      }
      else {
        if (pjVar3->cint_type != json_object_int_type_uint64) {
          json_abort("invalid cint_type");
        }
        pjVar3 = JC_INT_C((json_object *)cdouble);
        iVar1 = (pjVar3->cint).c_int64;
        auVar8._8_4_ = (int)((ulong)iVar1 >> 0x20);
        auVar8._0_8_ = iVar1;
        auVar8._12_4_ = 0x45300000;
        jso_local = (json_object *)
                    ((auVar8._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)iVar1) - 4503599627370496.0));
      }
      break;
    default:
      piVar7 = __errno_location();
      *piVar7 = 0x16;
      jso_local = (json_object *)0x0;
      break;
    case json_type_string:
      piVar7 = __errno_location();
      *piVar7 = 0;
      pcVar5 = get_string_component((json_object *)cdouble);
      errPtr = (char *)strtod(pcVar5,&local_28);
      pcVar5 = local_28;
      pcVar6 = get_string_component((json_object *)cdouble);
      if (pcVar5 == pcVar6) {
        piVar7 = __errno_location();
        *piVar7 = 0x16;
        jso_local = (json_object *)0x0;
      }
      else if (*local_28 == '\0') {
        if (((((double)errPtr == INFINITY) && (!NAN((double)errPtr))) ||
            (((double)errPtr == -INFINITY && (!NAN((double)errPtr))))) &&
           (piVar7 = __errno_location(), *piVar7 == 0x22)) {
          errPtr = (char *)0x0;
        }
        jso_local = (json_object *)errPtr;
      }
      else {
        piVar7 = __errno_location();
        *piVar7 = 0x16;
        jso_local = (json_object *)0x0;
      }
    }
  }
  return (double)jso_local;
}

Assistant:

double json_object_get_double(const struct json_object *jso)
{
	double cdouble;
	char *errPtr = NULL;

	if (!jso)
		return 0.0;
	switch (jso->o_type)
	{
	case json_type_double: return JC_DOUBLE_C(jso)->c_double;
	case json_type_int:
		switch (JC_INT_C(jso)->cint_type)
		{
		case json_object_int_type_int64: return JC_INT_C(jso)->cint.c_int64;
		case json_object_int_type_uint64: return JC_INT_C(jso)->cint.c_uint64;
		default: json_abort("invalid cint_type");
		}
	case json_type_boolean: return JC_BOOL_C(jso)->c_boolean;
	case json_type_string:
		errno = 0;
		cdouble = strtod(get_string_component(jso), &errPtr);

		/* if conversion stopped at the first character, return 0.0 */
		if (errPtr == get_string_component(jso))
		{
			errno = EINVAL;
			return 0.0;
		}

		/*
		 * Check that the conversion terminated on something sensible
		 *
		 * For example, { "pay" : 123AB } would parse as 123.
		 */
		if (*errPtr != '\0')
		{
			errno = EINVAL;
			return 0.0;
		}

		/*
		 * If strtod encounters a string which would exceed the
		 * capacity of a double, it returns +/- HUGE_VAL and sets
		 * errno to ERANGE. But +/- HUGE_VAL is also a valid result
		 * from a conversion, so we need to check errno.
		 *
		 * Underflow also sets errno to ERANGE, but it returns 0 in
		 * that case, which is what we will return anyway.
		 *
		 * See CERT guideline ERR30-C
		 */
		if ((HUGE_VAL == cdouble || -HUGE_VAL == cdouble) && (ERANGE == errno))
			cdouble = 0.0;
		return cdouble;
	default: errno = EINVAL; return 0.0;
	}
}